

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O3

AmsConnection * __thiscall AmsRouter::GetConnection(AmsRouter *this,AmsNetId *amsDest)

{
  int iVar1;
  iterator iVar2;
  AmsConnection *pAVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar1 == 0) {
    iVar2 = std::
            _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_AmsConnection_*>,_std::_Select1st<std::pair<const_AmsNetId,_AmsConnection_*>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
            ::find(&(this->mapping)._M_t,amsDest);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->mapping)._M_t._M_impl.super__Rb_tree_header) {
      pAVar3 = (AmsConnection *)0x0;
    }
    else {
      pAVar3 = (AmsConnection *)iVar2._M_node[1]._M_parent;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return pAVar3;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

AmsConnection* AmsRouter::GetConnection(const AmsNetId& amsDest)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    const auto it = mapping.find(amsDest);
    if (it != mapping.end()) {
        return it->second;
    }
    return nullptr;
}